

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::RALocalAllocator::replaceAssignment
          (RALocalAllocator *this,PhysToWorkMap *physToWorkMap)

{
  RAAssignment::copyFrom(&this->_curAssignment,physToWorkMap);
  return 0;
}

Assistant:

Error RALocalAllocator::replaceAssignment(const PhysToWorkMap* physToWorkMap) noexcept {
  _curAssignment.copyFrom(physToWorkMap);
  return kErrorOk;
}